

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void kratos::check_direction(Port *port1,Port *port2,bool same_direction)

{
  VarException *this;
  PortDirection PVar1;
  undefined7 in_register_00000011;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  Port *local_b8;
  Port *local_b0;
  string local_a8;
  pointer local_88;
  pointer ppIStack_80;
  pointer local_68;
  undefined8 uStack_60;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_48;
  undefined8 uStack_30;
  allocator_type local_21;
  
  PVar1 = (uint)(port1->direction_ == In);
  if ((int)CONCAT71(in_register_00000011,same_direction) != 0) {
    PVar1 = port1->direction_;
  }
  if (port2->direction_ == PVar1) {
    return;
  }
  this = (VarException *)__cxa_allocate_exception(0x10);
  (*(port1->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_88,port1);
  (*(port2->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_68,port2);
  local_48.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = local_88;
  local_48.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppIStack_80;
  local_48.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_68;
  uStack_30 = uStack_60;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x32;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_48;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_a8,(detail *)"Port {0} and port {1} doesn\'t match port direction",format_str,
             args);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_b8;
  local_b8 = port1;
  local_b0 = port2;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_48,__l,&local_21);
  VarException::VarException(this,&local_a8,&local_48);
  __cxa_throw(this,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void inline check_direction(const Port *port1, Port *port2, bool same_direction = false) {
    auto port1_dir = port1->port_direction();
    PortDirection correct_dir;
    if (same_direction)
        correct_dir = port1_dir;
    else if (port1_dir == PortDirection::In)
        correct_dir = PortDirection ::Out;
    else
        correct_dir = PortDirection ::In;
    if (port2->port_direction() != correct_dir) {
        throw VarException(::format("Port {0} and port {1} doesn't match port direction",
                                    port1->to_string(), port2->to_string()),
                           {port1, port2});
    }
}